

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O3

int Map_CompareNodesByLevel(Map_Node_t **ppS1,Map_Node_t **ppS2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *(uint *)(((ulong)*ppS1 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
  uVar3 = *(uint *)(((ulong)*ppS2 & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
  uVar2 = 0xffffffff;
  if (uVar1 <= uVar3) {
    uVar2 = (uint)(uVar1 < uVar3);
  }
  return uVar2;
}

Assistant:

int Map_CompareNodesByLevel( Map_Node_t ** ppS1, Map_Node_t ** ppS2 )
{
    Map_Node_t * pN1 = Map_Regular(*ppS1);
    Map_Node_t * pN2 = Map_Regular(*ppS2);
    if ( pN1->Level > pN2->Level )
        return -1;
    if ( pN1->Level < pN2->Level )
        return 1;
    return 0;
}